

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O0

int unpackIfAllDigits(char *input)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  int local_4c;
  int local_44;
  uint local_3c;
  int v_1;
  char *e;
  int v;
  int aonly;
  char *dotpos;
  char *s;
  char *input_local;
  
  _v = (char *)0x0;
  bVar3 = true;
  if (*input != 'A') {
    bVar3 = *input == 'a';
  }
  dotpos = input;
  if (bVar3) {
    dotpos = input + 1;
  }
  while( true ) {
    bVar4 = false;
    if ((*dotpos != '\0') && (bVar4 = false, dotpos[2] != '\0')) {
      bVar4 = dotpos[2] != '-';
    }
    if ((!bVar4) || (*dotpos == '-')) break;
    if ((*dotpos == '.') && (_v == (char *)0x0)) {
      _v = dotpos;
    }
    else {
      cVar1 = decodeChar(*dotpos);
      if ((cVar1 < '\0') || (cVar1 = decodeChar(*dotpos), '\t' < cVar1)) {
        return 0;
      }
    }
    dotpos = dotpos + 1;
  }
  if (_v != (char *)0x0) {
    if (bVar3) {
      if ((*dotpos == 'A') || (*dotpos == 'a')) {
        local_44 = 0x1f;
      }
      else {
        cVar1 = decodeChar(*dotpos);
        local_44 = (int)cVar1;
      }
      if ((dotpos[1] == 'A') || (dotpos[1] == 'a')) {
        local_4c = 0x1f;
      }
      else {
        cVar1 = decodeChar(dotpos[1]);
        local_4c = (int)cVar1;
      }
      local_4c = local_44 * 0x20 + local_4c;
      *input = (char)(local_4c / 100) + '0';
      *dotpos = (char)((long)((ulong)(uint)((int)((long)local_4c / 10) >> 0x1f) << 0x20 |
                             (long)local_4c / 10 & 0xffffffffU) % 10) + '0';
      dotpos[1] = (char)(local_4c % 10) + '0';
      return 1;
    }
    if (((((*dotpos == 'a') || (*dotpos == 'e')) || (*dotpos == 'u')) ||
        ((*dotpos == 'A' || (*dotpos == 'E')))) || (*dotpos == 'U')) {
      pcVar2 = dotpos + 1;
      local_3c = 0;
      if ((*dotpos == 'e') || (*dotpos == 'E')) {
        local_3c = 0x22;
      }
      else if ((*dotpos == 'u') || (*dotpos == 'U')) {
        local_3c = 0x44;
      }
      if ((*pcVar2 == 'a') || (*pcVar2 == 'A')) {
        local_3c = local_3c + 0x1f;
      }
      else if ((*pcVar2 == 'e') || (*pcVar2 == 'E')) {
        local_3c = local_3c + 0x20;
      }
      else if ((*pcVar2 == 'u') || (*pcVar2 == 'U')) {
        local_3c = local_3c + 0x21;
      }
      else {
        cVar1 = decodeChar(*pcVar2);
        if (cVar1 < '\0') {
          return -0x129;
        }
        cVar1 = decodeChar(*pcVar2);
        local_3c = (int)cVar1 + local_3c;
      }
      if ((int)local_3c < 100) {
        *dotpos = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[(ulong)local_3c / 10];
        *pcVar2 = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[(ulong)local_3c % 10];
        return 1;
      }
      return -0x127;
    }
  }
  return 0;
}

Assistant:

static int unpackIfAllDigits(char *input) {
    char *s = input;
    char *dotpos = NULL;
    const int aonly = ((*s == 'A') || (*s == 'a'));
    if (aonly) {
        s++;
    } // v1.50
    for (; *s != 0 && s[2] != 0 && s[2] != '-'; s++) {
        if (*s == '-') {
            break;
        } else if (*s == '.' && !dotpos) {
            dotpos = s;
        } else if ((decodeChar(*s) < 0) || (decodeChar(*s) > 9)) {
            return 0;
        }  // nondigit, so stop
    }

    if (dotpos) {
        if (aonly) // v1.50 encoded only with A's
        {
            const int v = (((s[0] == 'A') || (s[0] == 'a')) ? 31 : decodeChar(s[0])) * 32 +
                          (((s[1] == 'A') || (s[1] == 'a')) ? 31 : decodeChar(s[1]));
            *input = (char) ('0' + (v / 100));
            s[0] = (char) ('0' + ((v / 10) % 10));
            s[1] = (char) ('0' + (v % 10));
            return 1;
        } // v1.50

        if ((*s == 'a') || (*s == 'e') || (*s == 'u') ||
            (*s == 'A') || (*s == 'E') || (*s == 'U')) {
            char *e = s + 1;  // s is vowel, e is lastchar

            int v = 0;
            if (*s == 'e' || *s == 'E') {
                v = 34;
            } else if (*s == 'u' || *s == 'U') {
                v = 68;
            }

            if ((*e == 'a') || (*e == 'A')) {
                v += 31;
            } else if ((*e == 'e') || (*e == 'E')) {
                v += 32;
            } else if ((*e == 'u') || (*e == 'U')) {
                v += 33;
            } else if (decodeChar(*e) < 0) {
                return (int) ERR_INVALID_CHARACTER;
            } else {
                v += decodeChar(*e);
            }

            if (v < 100) {
                *s = ENCODE_CHARS[(unsigned int) v / 10];
                *e = ENCODE_CHARS[(unsigned int) v % 10];
            } else {
                return (int) ERR_INVALID_ENDVOWELS; // mapcodes ends in UE or UU
            }
            return 1;
        }
    }
    return 0; // no vowel just before end
}